

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O0

void Saturation::ProvingHelper::runVampire(Problem *prb,Options *opt)

{
  uint uVar1;
  Options *in_RSI;
  bad_alloc *anon_var_0;
  TimeLimitExceededException *anon_var_0_1;
  ActivationLimitExceededException *anon_var_0_2;
  Preprocess prepro;
  Problem *in_stack_00000030;
  ClauseIterator clauses;
  Problem *in_stack_000004a8;
  Preprocess *in_stack_000004b0;
  VirtualIterator<Kernel::Clause_*> *in_stack_ffffffffffffffb0;
  Preprocess local_38 [2];
  VirtualIterator<Kernel::Clause_*> local_18;
  Options *local_10;
  
  local_10 = in_RSI;
  uVar1 = Shell::Options::randomSeed(in_RSI);
  if (uVar1 == 0) {
    Lib::Random::resetSeed();
  }
  else {
    Shell::Options::randomSeed(local_10);
    Lib::Random::setSeed(0);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator(&local_18);
  Shell::Preprocess::Preprocess(local_38,local_10);
  Shell::Preprocess::preprocess(in_stack_000004b0,in_stack_000004a8);
  runVampireSaturationImpl(in_stack_00000030,(Options *)prepro._8_8_);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void ProvingHelper::runVampire(Problem& prb, const Options& opt)
{
  // Here officially starts preprocessing of the porfolio mode (separately for each worker)
  // and that's the moment we want to set the random seed
  // (no randomness in parsing, for the peace of mind - parsing was done by the master process!)
  // the main reason being that we want to stay in sync with what vampire mode does
  // cf getPreprocessedProblem in vampire.cpp
  if (opt.randomSeed() != 0) {
    Lib::Random::setSeed(opt.randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  try
  {
    ClauseIterator clauses;
    {
      TIME_TRACE(TimeTrace::PREPROCESSING);

      Preprocess prepro(opt);
      prepro.preprocess(prb);
    }
    runVampireSaturationImpl(prb, opt);
  }
  catch(const std::bad_alloc &) {
    env.statistics->terminationReason=TerminationReason::MEMORY_LIMIT;
    env.statistics->refutation=0;
  }
  catch(TimeLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::TIME_LIMIT;
    env.statistics->refutation=0;
  }
  catch(ActivationLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::ACTIVATION_LIMIT;
    env.statistics->refutation=0;
  }
}